

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::ClearDependencies
          (cmLocalUnixMakefileGenerator3 *this,cmMakefile *mf,bool verbose)

{
  bool bVar1;
  byte bVar2;
  string *psVar3;
  reference filename;
  cmState *this_00;
  cmGlobalGenerator *globalGenerator;
  ulong uVar4;
  cmCMakePath *pcVar5;
  string_view sVar6;
  undefined1 local_c38 [8];
  cmDependsCompiler depsManager;
  undefined1 local_c18 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string local_bf8;
  cmCMakePath local_bd8;
  undefined1 local_bb0 [8];
  cmCMakePath DepTimestamp;
  string local_b80;
  cmCMakePath local_b60;
  undefined1 local_b38 [8];
  cmCMakePath internalDepFile;
  cmCMakePath local_af0;
  undefined1 local_ac8 [8];
  cmCMakePath depFile;
  cmCMakePath local_a80;
  undefined1 local_a58 [8];
  cmCMakePath dir_1;
  string local_a28;
  string local_a08 [8];
  string depsFiles;
  undefined1 local_9e0 [8];
  string internalDependFile;
  string dependFile;
  string dir;
  string local_978;
  undefined1 local_958 [8];
  cmMakefile lmf;
  cmStateSnapshot snapshot;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_120;
  undefined1 local_100 [8];
  cmDepends clearer;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue infoDef;
  bool verbose_local;
  cmMakefile *mf_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  infoDef.Value._7_1_ = verbose;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_DEPEND_INFO_FILES",&local_49);
  local_28 = cmMakefile::GetDefinition(mf,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = cmValue::operator_cast_to_bool(&local_28);
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_(&local_28);
    sVar6 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
    clearer.IncludePath.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar6._M_len;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78,sVar6,false);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"",(allocator<char> *)((long)&__range1 + 7));
    cmDepends::cmDepends((cmDepends *)local_100,(cmLocalUnixMakefileGenerator3 *)0x0,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    cmDepends::SetVerbose((cmDepends *)local_100,(bool)(infoDef.Value._7_1_ & 1));
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_78);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar1) {
      filename = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      this_00 = cmMakefile::GetState(mf);
      cmState::CreateBaseSnapshot((cmStateSnapshot *)&lmf.IsSourceFileTryCompile,this_00);
      globalGenerator = cmMakefile::GetGlobalGenerator(mf);
      cmMakefile::cmMakefile
                ((cmMakefile *)local_958,globalGenerator,
                 (cmStateSnapshot *)&lmf.IsSourceFileTryCompile);
      cmMakefile::ReadListFile((cmMakefile *)local_958,filename);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_978,"CMAKE_DEPENDS_LANGUAGES",
                 (allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      cmMakefile::GetSafeDefinition((cmMakefile *)local_958,&local_978);
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_978);
      std::allocator<char>::~allocator((allocator<char> *)(dir.field_2._M_local_buf + 0xf));
      if (((bVar2 ^ 0xff) & 1) != 0) {
        cmsys::SystemTools::GetFilenamePath((string *)((long)&dependFile.field_2 + 8),filename);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internalDependFile.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dependFile.field_2 + 8),"/depend.make");
        cmDepends::Clear((cmDepends *)local_100,(string *)((long)&internalDependFile.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_9e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dependFile.field_2 + 8),"/depend.internal");
        depsFiles.field_2._8_8_ = cmsys::SystemTools::RemoveFile((string *)local_9e0);
        std::__cxx11::string::~string((string *)local_9e0);
        std::__cxx11::string::~string((string *)(internalDependFile.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(dependFile.field_2._M_local_buf + 8));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a28,"CMAKE_DEPENDS_DEPENDENCY_FILES",
                 (allocator<char> *)
                 ((long)&dir_1.Path._M_cmpts._M_impl._M_t.
                         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         ._M_t + 7));
      psVar3 = cmMakefile::GetSafeDefinition((cmMakefile *)local_958,&local_a28);
      std::__cxx11::string::string(local_a08,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_a28);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&dir_1.Path._M_cmpts._M_impl._M_t.
                         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         ._M_t + 7));
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::string((string *)&depFile.Path._M_cmpts,(string *)filename);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  (&local_a80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depFile.Path._M_cmpts,generic_format);
        cmCMakePath::GetParentPath((cmCMakePath *)local_a58,&local_a80);
        cmCMakePath::~cmCMakePath(&local_a80);
        std::__cxx11::string::~string((string *)&depFile.Path._M_cmpts);
        cmCMakePath::cmCMakePath(&local_af0,(cmCMakePath *)local_a58);
        pcVar5 = cmCMakePath::Append<char[21],cmCMakePath&>(&local_af0,(char (*) [21])0xd68fc8);
        cmCMakePath::cmCMakePath((cmCMakePath *)local_ac8,pcVar5);
        cmCMakePath::~cmCMakePath(&local_af0);
        cmCMakePath::GenericString_abi_cxx11_
                  ((string *)&internalDepFile.Path._M_cmpts,(cmCMakePath *)local_ac8);
        cmDepends::Clear((cmDepends *)local_100,(string *)&internalDepFile.Path._M_cmpts);
        std::__cxx11::string::~string((string *)&internalDepFile.Path._M_cmpts);
        cmCMakePath::cmCMakePath(&local_b60,(cmCMakePath *)local_a58);
        pcVar5 = cmCMakePath::Append<char[25],cmCMakePath&>(&local_b60,(char (*) [25])0xd68fae);
        cmCMakePath::cmCMakePath((cmCMakePath *)local_b38,pcVar5);
        cmCMakePath::~cmCMakePath(&local_b60);
        cmCMakePath::GenericString_abi_cxx11_(&local_b80,(cmCMakePath *)local_b38);
        DepTimestamp.Path._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )cmsys::SystemTools::RemoveFile(&local_b80);
        std::__cxx11::string::~string((string *)&local_b80);
        cmCMakePath::cmCMakePath(&local_bd8,(cmCMakePath *)local_a58);
        pcVar5 = cmCMakePath::Append<char[19],cmCMakePath&>(&local_bd8,(char (*) [19])0xd6988d);
        cmCMakePath::cmCMakePath((cmCMakePath *)local_bb0,pcVar5);
        cmCMakePath::~cmCMakePath(&local_bd8);
        cmCMakePath::GenericString_abi_cxx11_(&local_bf8,(cmCMakePath *)local_bb0);
        dependencies.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)cmsys::SystemTools::Touch(&local_bf8,true);
        std::__cxx11::string::~string((string *)&local_bf8);
        sVar6 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_a08);
        depsManager.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)sVar6._M_len;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c18,sVar6,true);
        cmDependsCompiler::cmDependsCompiler((cmDependsCompiler *)local_c38);
        cmDependsCompiler::SetVerbose
                  ((cmDependsCompiler *)local_c38,(bool)(infoDef.Value._7_1_ & 1));
        cmDependsCompiler::ClearDependencies
                  ((cmDependsCompiler *)local_c38,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c18);
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_bb0);
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_b38);
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_ac8);
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_a58);
      }
      std::__cxx11::string::~string(local_a08);
      cmMakefile::~cmMakefile((cmMakefile *)local_958);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmDepends::~cmDepends((cmDepends *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ClearDependencies(cmMakefile* mf,
                                                      bool verbose)
{
  // Get the list of target files to check
  cmValue infoDef = mf->GetDefinition("CMAKE_DEPEND_INFO_FILES");
  if (!infoDef) {
    return;
  }
  std::vector<std::string> files = cmExpandedList(*infoDef);

  // Each depend information file corresponds to a target.  Clear the
  // dependencies for that target.
  cmDepends clearer;
  clearer.SetVerbose(verbose);
  for (std::string const& file : files) {
    auto snapshot = mf->GetState()->CreateBaseSnapshot();
    cmMakefile lmf(mf->GetGlobalGenerator(), snapshot);
    lmf.ReadListFile(file);

    if (!lmf.GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(file);

      // Clear the implicit dependency makefile.
      std::string dependFile = dir + "/depend.make";
      clearer.Clear(dependFile);

      // Remove the internal dependency check file to force
      // regeneration.
      std::string internalDependFile = dir + "/depend.internal";
      cmSystemTools::RemoveFile(internalDependFile);
    }

    auto depsFiles = lmf.GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
    if (!depsFiles.empty()) {
      auto dir = cmCMakePath(file).GetParentPath();
      // Clear the implicit dependency makefile.
      auto depFile = cmCMakePath(dir).Append("compiler_depend.make");
      clearer.Clear(depFile.GenericString());

      // Remove the internal dependency check file
      auto internalDepFile =
        cmCMakePath(dir).Append("compiler_depend.internal");
      cmSystemTools::RemoveFile(internalDepFile.GenericString());

      // Touch timestamp file to force dependencies regeneration
      auto DepTimestamp = cmCMakePath(dir).Append("compiler_depend.ts");
      cmSystemTools::Touch(DepTimestamp.GenericString(), true);

      // clear the dependencies files generated by the compiler
      std::vector<std::string> dependencies = cmExpandedList(depsFiles, true);
      cmDependsCompiler depsManager;
      depsManager.SetVerbose(verbose);
      depsManager.ClearDependencies(dependencies);
    }
  }
}